

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O1

GeneratedProposal * __thiscall
FixedDegreeProposer::generate_proposal
          (GeneratedProposal *__return_storage_ptr__,FixedDegreeProposer *this,Network *network)

{
  Link old_link;
  Link LVar1;
  
  (__return_storage_ptr__->new_link1).first = 0;
  (__return_storage_ptr__->new_link1).second = 0;
  (__return_storage_ptr__->new_link2).first = 0;
  (__return_storage_ptr__->new_link2).second = 0;
  (__return_storage_ptr__->old_link1).first = 0;
  (__return_storage_ptr__->old_link1).second = 0;
  (__return_storage_ptr__->old_link2).first = 0;
  (__return_storage_ptr__->old_link2).second = 0;
  old_link = random_old_link(this,network);
  __return_storage_ptr__->old_link1 = old_link;
  LVar1 = random_new_link(this,network,old_link);
  __return_storage_ptr__->new_link1 = LVar1;
  LVar1 = FixedDegreeProposer::old_link(this,network,LVar1,old_link);
  __return_storage_ptr__->old_link2 = LVar1;
  (__return_storage_ptr__->new_link2).first = LVar1.second;
  (__return_storage_ptr__->new_link2).second = old_link.second;
  return __return_storage_ptr__;
}

Assistant:

GeneratedProposal generate_proposal(Network const& network) const {
        GeneratedProposal result;

        result.old_link1 = random_old_link(network);
        result.new_link1 = random_new_link(network, result.old_link1);
        result.old_link2 = old_link(network, result.new_link1, result.old_link1);
        result.new_link2 = new_link(result.old_link1, result.old_link2);

        return result;
    }